

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void async_func_free(JSRuntime *rt,JSAsyncFunctionState *s)

{
  int iVar1;
  JSValueUnion JVar2;
  JSValueUnion JVar3;
  int64_t iVar4;
  JSValueUnion *pJVar5;
  JSValueUnion *pJVar6;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  
  close_var_refs(rt,&s->frame);
  pJVar6 = &((s->frame).arg_buf)->u;
  if (pJVar6 != (JSValueUnion *)0x0) {
    pJVar5 = &((s->frame).cur_sp)->u;
    if (pJVar6 < pJVar5) {
      do {
        JVar2 = pJVar6[1];
        if (0xfffffff4 < (uint)JVar2.int32) {
          JVar3 = (JSValueUnion)pJVar6->ptr;
          iVar1 = *JVar3.ptr;
          *(int *)JVar3.ptr = iVar1 + -1;
          if (iVar1 < 2) {
            v.tag = (int64_t)JVar2.ptr;
            v.u = (JSValueUnion)(JSValueUnion)JVar3.ptr;
            __JS_FreeValueRT(rt,v);
            pJVar5 = &((s->frame).cur_sp)->u;
          }
        }
        pJVar6 = pJVar6 + 2;
      } while (pJVar6 < pJVar5);
      pJVar6 = &((s->frame).arg_buf)->u;
    }
    (*(rt->mf).js_free)(&rt->malloc_state,pJVar6);
  }
  iVar4 = (s->frame).cur_func.tag;
  if (0xfffffff4 < (uint)iVar4) {
    JVar2 = (JSValueUnion)(s->frame).cur_func.u.ptr;
    iVar1 = *JVar2.ptr;
    *(int *)JVar2.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      v_00.tag = iVar4;
      v_00.u.ptr = JVar2.ptr;
      __JS_FreeValueRT(rt,v_00);
    }
  }
  iVar4 = (s->this_val).tag;
  if (0xfffffff4 < (uint)iVar4) {
    JVar2 = (JSValueUnion)(s->this_val).u.ptr;
    iVar1 = *JVar2.ptr;
    *(int *)JVar2.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      v_01.tag = iVar4;
      v_01.u.ptr = JVar2.ptr;
      __JS_FreeValueRT(rt,v_01);
      return;
    }
  }
  return;
}

Assistant:

static void async_func_free(JSRuntime *rt, JSAsyncFunctionState *s)
{
    JSStackFrame *sf;
    JSValue *sp;

    sf = &s->frame;

    /* close the closure variables. */
    close_var_refs(rt, sf);
    
    if (sf->arg_buf) {
        /* cannot free the function if it is running */
        assert(sf->cur_sp != NULL);
        for(sp = sf->arg_buf; sp < sf->cur_sp; sp++) {
            JS_FreeValueRT(rt, *sp);
        }
        js_free_rt(rt, sf->arg_buf);
    }
    JS_FreeValueRT(rt, sf->cur_func);
    JS_FreeValueRT(rt, s->this_val);
}